

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringCopyInfo.cpp
# Opt level: O1

void Js::StringCopyInfo::InstantiateForceInlinedMembers(void)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  undefined1 local_40 [8];
  StringCopyInfo copyInfo;
  
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StringCopyInfo.cpp"
                              ,0x3d,"(false)","false");
  if (bVar2) {
    *puVar3 = 0;
    copyInfo.destinationBuffer._0_1_ = 0;
    StringCopyInfo((StringCopyInfo *)&copyInfo.isInitialized,(JavascriptString *)0x0,(char16 *)0x0);
    SourceString((StringCopyInfo *)local_40);
    DestinationBuffer((StringCopyInfo *)local_40);
    return;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void StringCopyInfo::InstantiateForceInlinedMembers()
    {
        // Force-inlined functions defined in a translation unit need a reference from an extern non-force-inlined function in
        // the same translation unit to force an instantiation of the force-inlined function. Otherwise, if the force-inlined
        // function is not referenced in the same translation unit, it will not be generated and the linker is not able to find
        // the definition to inline the function in other translation units.
        AnalysisAssert(false);

        StringCopyInfo copyInfo;
        JavascriptString *const string = nullptr;
        char16 *const buffer = nullptr;

        (StringCopyInfo());
        (StringCopyInfo(string, buffer));
        copyInfo.SourceString();
        copyInfo.DestinationBuffer();
    }